

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void crnlib::crn_comp::append_vec(vector<unsigned_char> *a,void *p,uint size)

{
  uint uVar1;
  
  if (size != 0) {
    uVar1 = a->m_size;
    vector<unsigned_char>::resize(a,uVar1 + size,false);
    memcpy(a->m_p + uVar1,p,(ulong)size);
    return;
  }
  return;
}

Assistant:

void crn_comp::append_vec(crnlib::vector<uint8>& a, const void* p, uint size) {
  if (size) {
    uint ofs = a.size();
    a.resize(ofs + size);

    memcpy(&a[ofs], p, size);
  }
}